

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_EulerAngles *this)

{
  ostream *poVar1;
  KFLOAT32 KVar2;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Psi: ");
  KVar2 = KFIXED<char,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_Psi);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)KVar2);
  poVar1 = std::operator<<(poVar1,",  Theta: ");
  KVar2 = KFIXED<char,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_Theta);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)KVar2);
  poVar1 = std::operator<<(poVar1,",  Phi: ");
  KVar2 = KFIXED<char,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_Phi);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)KVar2);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LE_EulerAngles::GetAsString() const
{
    KStringStream ss;

    ss << "Psi: "       << m_Psi.GetAsFloat32()
       << ",  Theta: "  << m_Theta.GetAsFloat32()
       << ",  Phi: "    << m_Phi.GetAsFloat32() << "\n";

    return ss.str();
}